

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void free_dfg_state(EVdfg_configuration state)

{
  int *in_RDI;
  int j;
  int i;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
    if (*(long *)(*(long *)(*(long *)(in_RDI + 2) + (long)local_c * 8) + 0x28) != 0) {
      free(*(void **)(*(long *)(*(long *)(in_RDI + 2) + (long)local_c * 8) + 0x28));
    }
    if (*(long *)(*(long *)(*(long *)(in_RDI + 2) + (long)local_c * 8) + 0x38) != 0) {
      free(*(void **)(*(long *)(*(long *)(in_RDI + 2) + (long)local_c * 8) + 0x38));
    }
    if (*(long *)(*(long *)(*(long *)(in_RDI + 2) + (long)local_c * 8) + 0x48) != 0) {
      free(*(void **)(*(long *)(*(long *)(in_RDI + 2) + (long)local_c * 8) + 0x48));
    }
    if (*(long *)(*(long *)(*(long *)(in_RDI + 2) + (long)local_c * 8) + 0x50) != 0) {
      for (local_10 = 0;
          local_10 < *(int *)(*(long *)(*(long *)(in_RDI + 2) + (long)local_c * 8) + 0x40) + -1;
          local_10 = local_10 + 1) {
        free(*(void **)(*(long *)(*(long *)(*(long *)(in_RDI + 2) + (long)local_c * 8) + 0x50) +
                       (long)local_10 * 8));
      }
      free(*(void **)(*(long *)(*(long *)(in_RDI + 2) + (long)local_c * 8) + 0x50));
    }
    if (*(long *)(*(long *)(*(long *)(in_RDI + 2) + (long)local_c * 8) + 0x10) != 0) {
      free_attr_list(*(undefined8 *)(*(long *)(*(long *)(in_RDI + 2) + (long)local_c * 8) + 0x10));
    }
    free(*(void **)(*(long *)(in_RDI + 2) + (long)local_c * 8));
  }
  if (*(long *)(in_RDI + 6) != 0) {
    free(*(void **)(in_RDI + 6));
  }
  free(*(void **)(in_RDI + 2));
  free(in_RDI);
  return;
}

Assistant:

static void
free_dfg_state(EVdfg_configuration state)
{
    int i;
    for (i=0; i < state->stone_count; i++) {
    	if (state->stones[i]->out_links) free(state->stones[i]->out_links);
    	if (state->stones[i]->in_links) free(state->stones[i]->in_links);
    	if (state->stones[i]->action) free(state->stones[i]->action);
    	if (state->stones[i]->extra_actions) {
    	    int j;
    	    for (j=0; j < state->stones[i]->action_count-1; j++) {
    		free(state->stones[i]->extra_actions[j]);
    	    }
    	    free(state->stones[i]->extra_actions);
    	}
    	if (state->stones[i]->attrs) free_attr_list(state->stones[i]->attrs);
    	free(state->stones[i]);
    }
    if (state->pending_action_queue) free(state->pending_action_queue);
    free(state->stones);
    free(state);
}